

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmaturePopulate.cpp
# Opt level: O3

aiNode * Assimp::ArmaturePopulate::GetArmatureRoot
                   (aiNode *bone_node,vector<aiBone_*,_std::allocator<aiBone_*>_> *bone_list)

{
  bool bVar1;
  Logger *pLVar2;
  long *local_1b8;
  long local_1a8 [2];
  char *local_198;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_190 [112];
  ios_base local_120 [264];
  
  if (bone_node != (aiNode *)0x0) {
    do {
      bVar1 = IsBoneNode(&bone_node->mName,bone_list);
      if (!bVar1) {
        pLVar2 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[41]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190
                   ,(char (*) [41])"GetArmatureRoot() Found valid armature: ");
        local_198 = (bone_node->mName).data;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  (local_190,&local_198);
        std::__cxx11::stringbuf::str();
        Logger::debug(pLVar2,(char *)local_1b8);
        if (local_1b8 != local_1a8) {
          operator_delete(local_1b8,local_1a8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
        std::ios_base::~ios_base(local_120);
        return bone_node;
      }
      bone_node = bone_node->mParent;
    } while (bone_node != (aiNode *)0x0);
  }
  pLVar2 = DefaultLogger::get();
  Logger::error(pLVar2,"GetArmatureRoot() can\'t find armature!");
  return (aiNode *)0x0;
}

Assistant:

aiNode *ArmaturePopulate::GetArmatureRoot(aiNode *bone_node,
                                          std::vector<aiBone *> &bone_list) {
  while (bone_node) {
    if (!IsBoneNode(bone_node->mName, bone_list)) {
      ASSIMP_LOG_DEBUG_F("GetArmatureRoot() Found valid armature: ", bone_node->mName.C_Str());
      return bone_node;
    }

    bone_node = bone_node->mParent;
  }
  
  ASSIMP_LOG_ERROR("GetArmatureRoot() can't find armature!");
  
  return nullptr;
}